

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  int *piVar1;
  int iVar2;
  ImGuiSettingsHandler *pIVar3;
  ImGuiContext *pIVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  ImGuiContext *ctx;
  long lVar8;
  long lVar9;
  
  pIVar4 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  iVar2 = (pIVar4->SettingsIniData).Buf.Capacity;
  if (iVar2 < 0) {
    piVar1 = &(pIVar4->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    pcVar5 = (char *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pcVar6 = (pIVar4->SettingsIniData).Buf.Data;
    if (pcVar6 != (char *)0x0) {
      memcpy(pcVar5,pcVar6,(long)(pIVar4->SettingsIniData).Buf.Size);
      pcVar6 = (pIVar4->SettingsIniData).Buf.Data;
      if ((pcVar6 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar6,GImAllocatorUserData);
    }
    (pIVar4->SettingsIniData).Buf.Data = pcVar5;
    (pIVar4->SettingsIniData).Buf.Size = 0;
    (pIVar4->SettingsIniData).Buf.Capacity = 0;
  }
  else {
    (pIVar4->SettingsIniData).Buf.Size = 0;
    if (iVar2 != 0) {
      pcVar6 = (pIVar4->SettingsIniData).Buf.Data;
      lVar8 = 0;
      goto LAB_00127ad0;
    }
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  pcVar6 = (char *)(*GImAllocatorAllocFunc)(8,GImAllocatorUserData);
  pcVar5 = (pIVar4->SettingsIniData).Buf.Data;
  if (pcVar5 != (char *)0x0) {
    memcpy(pcVar6,pcVar5,(long)(pIVar4->SettingsIniData).Buf.Size);
    pcVar5 = (pIVar4->SettingsIniData).Buf.Data;
    if ((pcVar5 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar5,GImAllocatorUserData);
  }
  (pIVar4->SettingsIniData).Buf.Data = pcVar6;
  (pIVar4->SettingsIniData).Buf.Capacity = 8;
  lVar8 = (long)(pIVar4->SettingsIniData).Buf.Size;
LAB_00127ad0:
  pcVar6[lVar8] = '\0';
  (pIVar4->SettingsIniData).Buf.Size = (pIVar4->SettingsIniData).Buf.Size + 1;
  if (0 < (pIVar4->SettingsHandlers).Size) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      pIVar3 = (pIVar4->SettingsHandlers).Data;
      (**(code **)((long)&pIVar3->WriteAllFn + lVar8))
                (pIVar4,(long)&pIVar3->TypeName + lVar8,&pIVar4->SettingsIniData);
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x30;
    } while (lVar9 < (pIVar4->SettingsHandlers).Size);
  }
  if (out_size != (size_t *)0x0) {
    sVar7 = (long)(pIVar4->SettingsIniData).Buf.Size - 1;
    if ((pIVar4->SettingsIniData).Buf.Data == (char *)0x0) {
      sVar7 = 0;
    }
    *out_size = sVar7;
  }
  pcVar6 = (pIVar4->SettingsIniData).Buf.Data;
  pcVar5 = ImGuiTextBuffer::EmptyString;
  if (pcVar6 != (char *)0x0) {
    pcVar5 = pcVar6;
  }
  return pcVar5;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}